

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O3

value_type __thiscall
jsoncons::jsonpath::detail::
tokenize_function<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
evaluate(tokenize_function<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
         *this,vector<jsoncons::jsonpath::parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
               *args,error_code *ec)

{
  char *pcVar1;
  long lVar2;
  bool bVar3;
  void *pvVar4;
  error_code *in_RCX;
  undefined8 extraout_RDX;
  undefined8 uVar5;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  jsonpath_errc __e;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar6;
  value_type vVar7;
  string_view_type sVar8;
  string_view_type sVar9;
  string_view_type sVar10;
  string_view_type sVar11;
  string_type s;
  string_type s0;
  string_type s1;
  basic_regex<wchar_t,_std::__cxx11::regex_traits<wchar_t>_> pieces_regex;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_wchar_t,_std::__cxx11::regex_traits<wchar_t>_>
  rend;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_wchar_t,_std::__cxx11::regex_traits<wchar_t>_>
  rit;
  semantic_tag local_1d1;
  wchar_t *local_1d0;
  undefined8 local_1c8;
  wchar_t local_1c0;
  undefined4 uStack_1bc;
  __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  local_1b0;
  long local_1a8;
  long local_1a0 [2];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_190;
  wchar_t *local_170;
  regex_type local_168;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_wchar_t,_std::__cxx11::regex_traits<wchar_t>_>
  local_148;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_wchar_t,_std::__cxx11::regex_traits<wchar_t>_>
  local_b8;
  
  pcVar1 = *(char **)ec;
  if (((long)ec->_M_cat - (long)pcVar1 >> 3) * -0x5555555555555555 -
      (long)(args->
            super__Vector_base<jsoncons::jsonpath::parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish == 0) {
    if (*pcVar1 == '\0') {
      pbVar6 = *(basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> **)(pcVar1 + 8)
      ;
    }
    else {
      pbVar6 = (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)(pcVar1 + 8);
    }
    bVar3 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::is_string(pbVar6);
    if (bVar3) {
      lVar2 = *(long *)ec;
      if (*(char *)(lVar2 + 0x18) == '\0') {
        pbVar6 = *(basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> **)
                  (lVar2 + 0x20);
      }
      else {
        pbVar6 = (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                 (lVar2 + 0x20);
      }
      bVar3 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::is_string(pbVar6)
      ;
      if (bVar3) {
        pcVar1 = *(char **)ec;
        if (*pcVar1 == '\0') {
          pbVar6 = *(basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> **)
                    (pcVar1 + 8);
        }
        else {
          pbVar6 = (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                   (pcVar1 + 8);
        }
        sVar8 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::as_string_view
                          (pbVar6);
        sVar9 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::as_string_view
                          (pbVar6);
        lVar2 = *(long *)ec;
        if (*(char *)(lVar2 + 0x18) == '\0') {
          pbVar6 = *(basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> **)
                    (lVar2 + 0x20);
        }
        else {
          pbVar6 = (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                   (lVar2 + 0x20);
        }
        sVar10 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::as_string_view
                           (pbVar6);
        sVar11 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::as_string_view
                           (pbVar6);
        local_1b0._M_current = (wchar_t *)local_1a0;
        std::__cxx11::wstring::_M_construct<wchar_t_const*>
                  ((wstring *)&local_1b0,sVar8._M_str,sVar8._M_str + sVar9._M_len);
        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
        std::__cxx11::wstring::_M_construct<wchar_t_const*>
                  ((wstring *)&local_190,sVar10._M_str,sVar10._M_str + sVar11._M_len);
        std::__cxx11::basic_regex<wchar_t,std::__cxx11::regex_traits<wchar_t>>::
        basic_regex<std::char_traits<wchar_t>,std::allocator<wchar_t>>
                  ((basic_regex<wchar_t,std::__cxx11::regex_traits<wchar_t>> *)&local_168,&local_190
                   ,0x10);
        std::__cxx11::
        regex_token_iterator<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_wchar_t,_std::__cxx11::regex_traits<wchar_t>_>
        ::regex_token_iterator
                  (&local_b8,local_1b0,
                   (__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                    )(local_1b0._M_current + local_1a8),&local_168,-1,0);
        local_148._M_suffix.
        super_pair<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,___gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        .second._M_current._0_1_ = 0;
        local_148._M_suffix._9_8_ = 0;
        local_148._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_148._M_suffix.
        super_pair<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,___gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        .first._M_current._0_1_ = 0;
        local_148._M_suffix.
        super_pair<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,___gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        .first._M_current._1_7_ = 0;
        local_148._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_148._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_148._M_position._M_match.
        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_148._M_position._M_match._M_begin._M_current = (wchar_t *)0x0;
        local_148._M_position._M_match.
        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_148._M_position._M_match.
        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_148._M_position._M_pregex = (regex_type *)0x0;
        local_148._M_position._M_flags = 0;
        local_148._M_position._28_4_ = 0;
        local_148._M_position._M_begin._M_current = (wchar_t *)0x0;
        local_148._M_position._M_end._M_current = (wchar_t *)0x0;
        local_148._M_n = 0;
        local_148._M_result = (value_type *)0x0;
        local_148._M_has_m1 = false;
        pvVar4 = operator_new(0x20);
        *(undefined8 *)((long)pvVar4 + 8) = 0;
        *(undefined8 *)((long)pvVar4 + 0x10) = 0;
        *(undefined8 *)((long)pvVar4 + 0x18) = 0;
        *(undefined2 *)
         &(this->
          super_function_base<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
          )._vptr_function_base = 0xe;
        (this->
        super_function_base<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
        ).arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._M_payload._M_value = (unsigned_long)pvVar4;
        while( true ) {
          bVar3 = std::__cxx11::
                  regex_token_iterator<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_wchar_t,_std::__cxx11::regex_traits<wchar_t>_>
                  ::operator==(&local_b8,&local_148);
          if (bVar3) break;
          local_1d0 = &local_1c0;
          if ((local_b8._M_result)->matched == true) {
            std::__cxx11::wstring::
            _M_construct<__gnu_cxx::__normal_iterator<wchar_t_const*,std::__cxx11::wstring>>
                      ((wstring *)&local_1d0,
                       ((local_b8._M_result)->
                       super_pair<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,___gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                       ).first._M_current,
                       ((local_b8._M_result)->
                       super_pair<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,___gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                       ).second._M_current);
          }
          else {
            local_1c8 = 0;
            local_1c0 = L'\0';
          }
          local_1d1 = none;
          local_170 = local_1d0;
          basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
          emplace_back<wchar_t_const*,jsoncons::semantic_tag>
                    ((basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>> *)this,
                     &local_170,&local_1d1);
          std::__cxx11::
          regex_token_iterator<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_wchar_t,_std::__cxx11::regex_traits<wchar_t>_>
          ::operator++(&local_b8);
          if (local_1d0 != &local_1c0) {
            operator_delete(local_1d0,CONCAT44(uStack_1bc,local_1c0) * 4 + 4);
          }
        }
        if (local_148._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_148._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_148._M_subs.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_148._M_subs.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_148._M_position._M_match.
            super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>_>
            .
            super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_148._M_position._M_match.
                          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_148._M_position._M_match.
                                super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>_>
                                .
                                super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_148._M_position._M_match.
                                super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>_>
                                .
                                super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_b8._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_b8._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_b8._M_subs.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_b8._M_subs.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_b8._M_position._M_match.
            super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>_>
            .
            super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_b8._M_position._M_match.
                          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_b8._M_position._M_match.
                                super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>_>
                                .
                                super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_b8._M_position._M_match.
                                super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>_>
                                .
                                super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        std::__cxx11::basic_regex<wchar_t,_std::__cxx11::regex_traits<wchar_t>_>::~basic_regex
                  (&local_168);
        uVar5 = extraout_RDX_00;
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_190._M_dataplus._M_p != &local_190.field_2) {
          operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity * 4 + 4
                         );
          uVar5 = extraout_RDX_01;
        }
        if (local_1b0._M_current != (wchar_t *)local_1a0) {
          operator_delete(local_1b0._M_current,local_1a0[0] * 4 + 4);
          uVar5 = extraout_RDX_02;
        }
        goto LAB_003e9a3c;
      }
    }
    __e = invalid_type;
  }
  else {
    __e = invalid_arity;
  }
  std::error_code::operator=(in_RCX,__e);
  pbVar6 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::null();
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::uninitialized_copy
            ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,pbVar6);
  uVar5 = extraout_RDX;
LAB_003e9a3c:
  vVar7.field_0.int64_.val_ = uVar5;
  vVar7.field_0._0_8_ = this;
  return (value_type)vVar7.field_0;
}

Assistant:

value_type evaluate(const std::vector<parameter_type>& args, 
            std::error_code& ec) const override
        {
            if (args.size() != *this->arity())
            {
                ec = jsonpath_errc::invalid_arity;
                return value_type::null();
            }

            if (!args[0].value().is_string() || !args[1].value().is_string())
            {
                //std::cout << "arg: " << arg0 << "\n";
                ec = jsonpath_errc::invalid_type;
                return value_type::null();
            }
            auto arg0 = args[0].value().template as<string_view_type>();
            auto arg1 = args[1].value().template as<string_view_type>();

            auto s0 = string_type(arg0.begin(), arg0.end(), alloc_);
            auto s1 = string_type(arg1.begin(), arg1.end(), alloc_);

            std::regex::flag_type options = std::regex_constants::ECMAScript; 
            std::basic_regex<char_type> pieces_regex(s1, options);

            std::regex_token_iterator<typename string_type::const_iterator> rit ( s0.begin(), s0.end(), pieces_regex, -1);
            std::regex_token_iterator<typename string_type::const_iterator> rend;

            value_type j(json_array_arg, semantic_tag::none, alloc_);
            while (rit != rend) 
            {
                auto s = (*rit).str();
                j.emplace_back(s.c_str(), semantic_tag::none);
                ++rit;
            }
            return j;
        }